

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

void __thiscall
llvm::Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
~Expected(Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
          *this)

{
  long *plVar1;
  pointer *__ptr;
  
  plVar1 = *(long **)&this->field_0;
  if ((this->field_0x18 & 1) == 0) {
    if (plVar1 != (long *)0x0) {
      operator_delete(plVar1,*(long *)((long)&this->field_0 + 0x10) - (long)plVar1);
      return;
    }
  }
  else {
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    *(undefined8 *)(this->field_0).ErrorStorage.buffer = 0;
  }
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }